

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
vector_representation_abi_cxx11_
          (vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *vector)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  const_iterator it;
  string elements_str;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a0 [32];
  shared_ptr<Instance> *local_80;
  string local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  __normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  local_38;
  string local_30 [48];
  
  __lhs = in_RDI;
  std::__cxx11::string::string(local_30);
  local_38._M_current =
       (shared_ptr<Instance> *)
       std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                 (in_stack_ffffffffffffff48);
  while( true ) {
    std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
              (in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
              (in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (bVar1) {
      std::__cxx11::string::operator+=(local_30,",");
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
    ::operator*(&local_38);
    peVar2 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1b348d);
    (*peVar2->_vptr_Instance[2])(local_78);
    std::__cxx11::string::operator+=(local_30,local_78);
    std::__cxx11::string::~string(local_78);
    local_80 = (shared_ptr<Instance> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
               ::operator++((__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                             *)__lhs,(int)((ulong)in_RDI >> 0x20));
  }
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_30);
  return __lhs;
}

Assistant:

std::string vector_representation(const std::vector<std::shared_ptr<Instance>>& vector) {
    std::string elements_str;
    for (auto it = vector.begin(); it != vector.end(); it++) {
        if (it != vector.begin())
            elements_str += ",";
        elements_str += (*it)->representation();
    }
    return "[" + elements_str + "]";
}